

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  void *pvVar1;
  void *pvVar2;
  uint in_ECX;
  ulong *in_RSI;
  long *in_RDI;
  uint in_R8D;
  long in_R9;
  uint unaff_retaddr;
  uint unaff_retaddr_00;
  uchar *in_stack_00000008;
  uchar *in_stack_00000010;
  uchar *padded_1;
  uint i;
  uchar *adam7;
  size_t passstart [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  uint passh [7];
  uint passw [7];
  uchar *padded;
  uint error;
  uint bpp;
  LodePNGEncoderSettings *in_stack_00000468;
  LodePNGColorMode *in_stack_00000470;
  uint in_stack_00000478;
  uint in_stack_0000047c;
  uchar *in_stack_00000480;
  uchar *in_stack_00000488;
  int local_144;
  undefined8 in_stack_fffffffffffffec0;
  uint h_00;
  size_t in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  uchar *in_stack_fffffffffffffed8;
  uchar *in_stack_fffffffffffffee0;
  long local_100;
  size_t local_f8 [8];
  size_t local_b8 [7];
  ulong local_80;
  uint local_78 [8];
  uint local_58 [8];
  void *local_38;
  uint local_30;
  uint local_2c;
  long local_28;
  uint local_20;
  uint local_1c;
  ulong *local_10;
  
  h_00 = (uint)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_28 = in_R9;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_10 = in_RSI;
  local_2c = lodepng_get_bpp((LodePNGColorMode *)0x112c2f);
  local_30 = 0;
  if (*(int *)(local_28 + 8) == 0) {
    *local_10 = (ulong)(local_20 + local_20 * (local_1c * local_2c + 7 >> 3));
    pvVar1 = lodepng_malloc(0x112c9a);
    *in_RDI = (long)pvVar1;
    if ((*in_RDI == 0) && (*local_10 != 0)) {
      local_30 = 0x53;
    }
    if (local_30 == 0) {
      if ((local_2c < 8) && (local_1c * local_2c != (local_1c * local_2c + 7 & 0xfffffff8))) {
        local_38 = lodepng_malloc(0x112d42);
        if (local_38 == (void *)0x0) {
          local_30 = 0x53;
        }
        if (local_30 == 0) {
          addPaddingBits(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,h_00);
          local_30 = filter(in_stack_00000488,in_stack_00000480,in_stack_0000047c,in_stack_00000478,
                            in_stack_00000470,in_stack_00000468);
        }
        lodepng_free((void *)0x112e08);
      }
      else {
        local_30 = filter(in_stack_00000488,in_stack_00000480,in_stack_0000047c,in_stack_00000478,
                          in_stack_00000470,in_stack_00000468);
      }
    }
  }
  else {
    Adam7_getpassvalues(local_58,local_78,local_b8,local_f8,(size_t *)&stack0xfffffffffffffec8,
                        local_1c,local_20,local_2c);
    *local_10 = local_80;
    pvVar1 = lodepng_malloc(0x112ebb);
    *in_RDI = (long)pvVar1;
    if (*in_RDI == 0) {
      local_30 = 0x53;
    }
    pvVar1 = lodepng_malloc(0x112eec);
    if ((pvVar1 == (void *)0x0) && (local_100 != 0)) {
      local_30 = 0x53;
    }
    if (local_30 == 0) {
      Adam7_interlace(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                      (uint)((ulong)in_RDI >> 0x20));
      for (local_144 = 0; local_144 != 7; local_144 = local_144 + 1) {
        if (local_2c < 8) {
          pvVar2 = lodepng_malloc(0x112f7f);
          if (pvVar2 == (void *)0x0) {
            local_30 = 0x53;
            break;
          }
          addPaddingBits(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         (uint)((ulong)pvVar1 >> 0x20));
          local_30 = filter(in_stack_00000488,in_stack_00000480,in_stack_0000047c,in_stack_00000478,
                            in_stack_00000470,in_stack_00000468);
          lodepng_free((void *)0x113053);
        }
        else {
          local_30 = filter(in_stack_00000488,in_stack_00000480,in_stack_0000047c,in_stack_00000478,
                            in_stack_00000470,in_stack_00000468);
        }
        if (local_30 != 0) break;
      }
    }
    lodepng_free((void *)0x1130da);
  }
  return local_30;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
                                    unsigned w, unsigned h,
                                    const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings)
{
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= posible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  unsigned bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;

  if(info_png->interlace_method == 0)
  {
    *outsize = h + (h * ((w * bpp + 7) / 8)); /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if(!error)
    {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if(bpp < 8 && w * bpp != ((w * bpp + 7) / 8) * 8)
      {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7) / 8));
        if(!padded) error = 83; /*alloc fail*/
        if(!error)
        {
          addPaddingBits(padded, in, ((w * bpp + 7) / 8) * 8, w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      }
      else
      {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  }
  else /*interlace_method is 1 (Adam7)*/
  {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if(!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if(!error)
    {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, bpp);
      for(i = 0; i != 7; ++i)
      {
        if(bpp < 8)
        {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if(!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
                         ((passw[i] * bpp + 7) / 8) * 8, passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
                         passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        }
        else
        {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
                         passw[i], passh[i], &info_png->color, settings);
        }

        if(error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}